

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O1

void ss_mintrosort(sauchar_t *T,saidx64_t *PA,saidx64_t *first,saidx64_t *last,saidx64_t depth)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  undefined8 uVar4;
  sauchar_t *psVar5;
  int iVar6;
  byte bVar11;
  ulong uVar7;
  ulong *puVar8;
  ulong *puVar9;
  ulong *puVar10;
  saint_t sVar12;
  byte *pbVar13;
  ulong *puVar14;
  long lVar15;
  long lVar16;
  byte bVar17;
  saidx64_t v;
  ulong *puVar18;
  ulong *puVar19;
  long lVar20;
  long lVar21;
  byte bVar22;
  sauchar_t *psVar23;
  ulong uVar24;
  long lVar25;
  sauchar_t *psVar26;
  ulong uVar27;
  ulong *puVar28;
  saint_t sVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  byte *pbVar33;
  byte *pbVar34;
  ulong uVar35;
  ulong uVar36;
  bool bVar37;
  bool bVar38;
  ulong auStack_298 [2];
  ulong local_288;
  int local_280 [18];
  ulong local_238 [7];
  long alStack_200 [58];
  
  uVar7 = (long)last - (long)first >> 3;
  if (((long)last - (long)first & 0x7f800U) == 0) {
    sVar29 = lg_table[uVar7 & 0xff];
  }
  else {
    sVar29 = lg_table[uVar7 >> 8 & 0xff] + 8;
  }
  local_288 = 0;
  bVar22 = 0;
LAB_001023ef:
  do {
    uVar32 = (long)last - (long)first;
    uVar7 = (long)uVar32 >> 3;
    puVar19 = (ulong *)first;
    iVar6 = sVar29;
    if ((long)uVar7 < 9) {
      local_288 = (ulong)(int)local_288;
      do {
        if ((1 < (long)uVar7) && (puVar19 = (ulong *)last + -2, first <= puVar19)) {
          psVar23 = T + depth;
LAB_00102438:
          uVar7 = *puVar19;
          puVar14 = puVar19 + 1;
          do {
            lVar25 = PA[uVar7];
            pbVar34 = psVar23 + lVar25;
            lVar15 = PA[*puVar14];
            pbVar33 = psVar23 + lVar15;
            pbVar13 = T + PA[*puVar14 + 1] + 2;
            bVar37 = pbVar33 < pbVar13;
            bVar38 = pbVar34 < T + PA[uVar7 + 1] + 2;
            if ((bVar38) && (pbVar33 < pbVar13)) {
              bVar38 = true;
              bVar37 = true;
              if (*pbVar34 == *pbVar33) {
                psVar5 = psVar23;
                do {
                  psVar26 = psVar5;
                  pbVar34 = psVar26 + lVar15 + 1;
                  bVar37 = pbVar34 < pbVar13;
                  bVar38 = psVar26 + lVar25 + 1 < T + PA[uVar7 + 1] + 2;
                  if ((!bVar38) || (pbVar13 <= pbVar34)) goto LAB_001024c9;
                  psVar5 = psVar26 + 1;
                } while (psVar26[lVar25 + 1] == *pbVar34);
                bVar38 = true;
                bVar37 = true;
LAB_001024c9:
                pbVar33 = psVar26 + lVar15 + 1;
                pbVar34 = psVar26 + lVar25 + 1;
              }
            }
            if (bVar38) {
              iVar6 = 1;
              if (bVar37 != false) {
                iVar6 = (uint)*pbVar34 - (uint)*pbVar33;
              }
            }
            else {
              iVar6 = -(uint)bVar37;
            }
            if (iVar6 < 1) goto LAB_00102530;
            do {
              puVar14[-1] = *puVar14;
              puVar8 = puVar14 + 1;
              if (last <= puVar8) {
                puVar14 = puVar14 + 1;
                goto LAB_00102530;
              }
              puVar14 = puVar8;
            } while ((long)*puVar8 < 0);
          } while( true );
        }
LAB_0010254d:
        bVar38 = local_288 == 0;
        local_288 = local_288 - 1;
        if (bVar38) {
          return;
        }
        first = (saidx64_t *)local_238[local_288 * 4];
        last = (saidx64_t *)local_238[local_288 * 4 + 1];
        depth = local_238[local_288 * 4 + 2];
        uVar32 = (long)last - (long)first;
        uVar7 = (long)uVar32 >> 3;
      } while ((long)uVar7 < 9);
      puVar19 = (ulong *)first;
      iVar6 = *(int *)(local_238 + local_288 * 4 + 3);
    }
    sVar29 = iVar6 + -1;
    if (iVar6 == 0) {
      uVar30 = uVar7;
      if ((uVar32 & 8) == 0) {
        uVar30 = uVar7 - 1;
        uVar35 = puVar19[uVar7 - 1];
        if (T[PA[puVar19[uVar30 >> 1]] + depth] < T[PA[uVar35] + depth]) {
          puVar19[uVar7 - 1] = puVar19[uVar30 >> 1];
          puVar19[uVar30 >> 1] = uVar35;
        }
      }
      if (1 < uVar30) {
        uVar35 = uVar30 >> 1;
        do {
          uVar36 = uVar35 - 1;
          uVar3 = puVar19[uVar35 - 1];
          uVar31 = uVar35 * 2 - 1;
          uVar24 = uVar36;
          if ((long)uVar31 < (long)uVar30) {
            bVar11 = T[PA[uVar3] + depth];
            lVar25 = uVar35 * 2 + -2;
            uVar27 = uVar36;
            do {
              bVar1 = T[PA[puVar19[uVar31]] + depth];
              bVar2 = T[PA[puVar19[lVar25 + 2]] + depth];
              bVar17 = bVar2;
              if (bVar2 < bVar1) {
                bVar17 = bVar1;
              }
              uVar24 = uVar27;
              if (bVar17 <= bVar11) break;
              uVar24 = uVar31;
              if (bVar1 < bVar2) {
                uVar24 = lVar25 + 2;
              }
              puVar19[uVar27] = puVar19[uVar24];
              lVar25 = uVar24 * 2;
              uVar31 = uVar24 * 2 + 1;
              uVar27 = uVar24;
            } while ((long)uVar31 < (long)uVar30);
          }
          puVar19[uVar24] = uVar3;
          bVar38 = 1 < (long)uVar35;
          uVar35 = uVar36;
        } while (bVar38);
      }
      if ((uVar32 & 8) == 0) {
        uVar32 = *puVar19;
        *puVar19 = puVar19[uVar30];
        puVar19[uVar30] = uVar32;
        uVar32 = *puVar19;
        if ((long)uVar30 < 2) {
          lVar25 = 0;
        }
        else {
          bVar11 = T[PA[uVar32] + depth];
          lVar15 = 1;
          lVar16 = 0;
          lVar20 = 0;
          do {
            bVar1 = T[PA[puVar19[lVar15]] + depth];
            bVar2 = T[PA[puVar19[lVar16 + 2]] + depth];
            bVar17 = bVar2;
            if (bVar2 < bVar1) {
              bVar17 = bVar1;
            }
            lVar25 = lVar20;
            if (bVar17 <= bVar11) break;
            lVar25 = lVar15;
            if (bVar1 < bVar2) {
              lVar25 = lVar16 + 2;
            }
            puVar19[lVar20] = puVar19[lVar25];
            lVar16 = lVar25 * 2;
            lVar15 = lVar25 * 2 + 1;
            lVar20 = lVar25;
          } while (lVar15 < (long)uVar30);
        }
        puVar19[lVar25] = uVar32;
      }
      if (1 < (long)uVar30) {
        do {
          uVar31 = uVar30 - 1;
          uVar32 = *puVar19;
          uVar35 = puVar19[uVar30 - 1];
          *puVar19 = uVar35;
          if (uVar30 == 2) {
            lVar20 = 0;
          }
          else {
            bVar11 = T[PA[uVar35] + depth];
            lVar25 = 1;
            lVar15 = 0;
            lVar16 = 0;
            do {
              bVar1 = T[PA[puVar19[lVar25]] + depth];
              bVar2 = T[PA[puVar19[lVar15 + 2]] + depth];
              bVar17 = bVar2;
              if (bVar2 < bVar1) {
                bVar17 = bVar1;
              }
              lVar20 = lVar16;
              if (bVar17 <= bVar11) break;
              lVar20 = lVar25;
              if (bVar1 < bVar2) {
                lVar20 = lVar15 + 2;
              }
              puVar19[lVar16] = puVar19[lVar20];
              lVar15 = lVar20 * 2;
              lVar25 = lVar20 * 2 + 1;
              lVar16 = lVar20;
            } while (lVar25 < (long)uVar31);
          }
          puVar19[lVar20] = uVar35;
          puVar19[uVar31] = uVar32;
          bVar38 = 2 < (long)uVar30;
          uVar30 = uVar31;
        } while (bVar38);
      }
    }
    if (0 < iVar6) {
      puVar14 = (ulong *)((long)puVar19 + (uVar7 & 0xfffffffffffffffe) * 4);
      if (uVar7 < 0x201) {
        if (uVar7 < 0x21) {
          puVar28 = puVar14;
          if (T[PA[*puVar14] + depth] < T[PA[*puVar19] + depth]) {
            puVar28 = puVar19;
          }
          if (T[PA[((ulong *)last)[-1]] + depth] < T[PA[*puVar28] + depth]) {
            if (T[PA[*puVar19] + depth] <= T[PA[*puVar14] + depth]) {
              puVar14 = puVar19;
            }
            puVar28 = puVar14;
            if (T[PA[*puVar14] + depth] <= T[PA[((ulong *)last)[-1]] + depth]) {
              puVar28 = (ulong *)last + -1;
            }
          }
        }
        else {
          uVar7 = uVar7 >> 2;
          puVar8 = puVar19 + uVar7;
          lVar25 = -uVar7;
          puVar18 = puVar8;
          if (T[PA[*puVar14] + depth] < T[PA[*puVar8] + depth]) {
            puVar18 = puVar14;
          }
          if (T[PA[*puVar14] + depth] < T[PA[*puVar8] + depth]) {
            puVar14 = puVar8;
          }
          puVar8 = (ulong *)last + (-1 - uVar7);
          puVar9 = (ulong *)last + -1;
          if (T[PA[((ulong *)last)[-1]] + depth] < T[PA[*puVar8] + depth]) {
            puVar9 = puVar8;
            lVar25 = 0;
            puVar8 = (ulong *)last + -1;
          }
          puVar10 = puVar9;
          if (T[PA[((ulong *)last)[lVar25 + -1]] + depth] < T[PA[*puVar18] + depth]) {
            puVar10 = puVar14;
            puVar14 = puVar9;
            puVar8 = puVar18;
          }
          puVar18 = puVar14;
          puVar28 = puVar19;
          if (T[PA[*puVar14] + depth] < T[PA[*puVar19] + depth]) {
            puVar18 = puVar19;
            puVar28 = puVar14;
          }
          if (T[PA[*puVar28] + depth] <= T[PA[*puVar8] + depth]) {
            puVar28 = puVar8;
            puVar10 = puVar18;
          }
          if (T[PA[*puVar10] + depth] <= T[PA[*puVar28] + depth]) {
            puVar28 = puVar10;
          }
        }
      }
      else {
        uVar32 = uVar7 >> 3;
        puVar8 = (ulong *)((long)puVar19 + (uVar7 & 0xfffffffffffffff8));
        puVar18 = puVar8;
        if (T[PA[*(long *)((long)puVar19 + (uVar7 & 0xfffffffffffffff8))] + depth] <
            T[PA[*puVar19] + depth]) {
          puVar18 = puVar19;
        }
        if (T[PA[puVar19[uVar32 * 2]] + depth] < T[PA[*puVar18] + depth]) {
          if (T[PA[*puVar19] + depth] <=
              T[PA[*(long *)((long)puVar19 + (uVar7 & 0xfffffffffffffff8))] + depth]) {
            puVar8 = puVar19;
          }
          puVar18 = puVar8;
          if (T[PA[*puVar8] + depth] <= T[PA[puVar19[uVar32 * 2]] + depth]) {
            puVar18 = puVar19 + uVar32 * 2;
          }
        }
        lVar15 = -uVar32;
        puVar8 = puVar14 + -uVar32;
        puVar9 = puVar14;
        lVar25 = 0;
        if (T[PA[*puVar14] + depth] < T[PA[*puVar8] + depth]) {
          puVar9 = puVar8;
          lVar25 = lVar15;
        }
        if (T[PA[puVar14[uVar32]] + depth] < T[PA[puVar14[lVar25]] + depth]) {
          if (T[PA[*puVar14] + depth] < T[PA[*puVar8] + depth]) {
            puVar8 = puVar14;
          }
          puVar9 = puVar8;
          if (T[PA[*puVar8] + depth] <= T[PA[puVar14[uVar32]] + depth]) {
            puVar9 = puVar14 + uVar32;
          }
        }
        puVar14 = (ulong *)last + -1;
        puVar28 = (ulong *)last + (-1 - uVar32);
        puVar8 = puVar28;
        if (T[PA[*puVar28] + depth] < T[PA[((ulong *)last)[uVar32 * -2 + -1]] + depth]) {
          puVar8 = puVar14 + uVar32 * -2;
          lVar15 = uVar32 * -2;
        }
        if (T[PA[((ulong *)last)[-1]] + depth] < T[PA[((ulong *)last)[lVar15 + -1]] + depth]) {
          puVar10 = puVar14 + uVar32 * -2;
          if (T[PA[*puVar28] + depth] < T[PA[((ulong *)last)[uVar32 * -2 + -1]] + depth]) {
            puVar10 = puVar28;
          }
          puVar8 = puVar14;
          if (T[PA[((ulong *)last)[-1]] + depth] < T[PA[*puVar10] + depth]) {
            puVar8 = puVar10;
          }
        }
        puVar28 = puVar9;
        if (T[PA[*puVar9] + depth] < T[PA[*puVar18] + depth]) {
          puVar28 = puVar18;
        }
        if (T[PA[*puVar8] + depth] < T[PA[*puVar28] + depth]) {
          if (T[PA[*puVar9] + depth] < T[PA[*puVar18] + depth]) {
            puVar18 = puVar9;
          }
          puVar28 = puVar8;
          if (T[PA[*puVar8] + depth] < T[PA[*puVar18] + depth]) {
            puVar28 = puVar18;
          }
        }
      }
      bVar11 = T[PA[*puVar28] + depth];
      uVar7 = *puVar19;
      *puVar19 = *puVar28;
      *puVar28 = uVar7;
      puVar14 = puVar19 + 1;
      bVar38 = puVar14 < last;
      if ((bVar38) && (bVar22 = T[PA[*puVar14] + depth], bVar22 == bVar11)) {
        puVar8 = puVar19 + 2;
        do {
          puVar14 = puVar8;
          bVar38 = puVar14 < last;
          if (!bVar38) break;
          bVar22 = T[PA[*puVar14] + depth];
          puVar8 = puVar14 + 1;
        } while (bVar22 == bVar11);
      }
      puVar8 = puVar14;
      if ((bVar38) && (bVar22 < bVar11)) {
        while (puVar8 = puVar8 + 1, puVar8 < last) {
          uVar7 = *puVar8;
          bVar22 = T[PA[uVar7] + depth];
          if (bVar11 < bVar22) break;
          if (bVar22 == bVar11) {
            *puVar8 = *puVar14;
            *puVar14 = uVar7;
            puVar14 = puVar14 + 1;
          }
        }
      }
      puVar18 = (ulong *)last + -1;
      bVar38 = puVar8 < puVar18;
      if ((bVar38) && (bVar22 = T[PA[*puVar18] + depth], bVar22 == bVar11)) {
        puVar9 = (ulong *)last + -2;
        do {
          puVar18 = puVar9;
          bVar38 = puVar8 < puVar18;
          if (!bVar38) break;
          bVar22 = T[PA[*puVar18] + depth];
          puVar9 = puVar18 + -1;
        } while (bVar22 == bVar11);
      }
      puVar9 = puVar18;
      if ((bVar38) && (bVar11 < bVar22)) {
        while (puVar9 = puVar9 + -1, puVar8 < puVar9) {
          uVar7 = *puVar9;
          bVar22 = T[PA[uVar7] + depth];
          if (bVar22 < bVar11) break;
          if (bVar22 == bVar11) {
            *puVar9 = *puVar18;
            *puVar18 = uVar7;
            puVar18 = puVar18 + -1;
          }
        }
      }
LAB_00102d77:
      if (puVar8 < puVar9) {
        uVar7 = *puVar8;
        *puVar8 = *puVar9;
        *puVar9 = uVar7;
        while (puVar8 = puVar8 + 1, puVar8 < puVar9) {
          uVar7 = *puVar8;
          bVar22 = T[PA[uVar7] + depth];
          if (bVar11 < bVar22) break;
          if (bVar22 == bVar11) {
            *puVar8 = *puVar14;
            *puVar14 = uVar7;
            puVar14 = puVar14 + 1;
          }
        }
LAB_00102d5d:
        puVar9 = puVar9 + -1;
        if (puVar8 < puVar9) {
          uVar7 = *puVar9;
          bVar22 = T[PA[uVar7] + depth];
          if (bVar22 < bVar11) goto LAB_00102d77;
          if (bVar22 == bVar11) {
            *puVar9 = *puVar18;
            *puVar18 = uVar7;
            puVar18 = puVar18 + -1;
          }
          goto LAB_00102d5d;
        }
        goto LAB_00102d77;
      }
      if (puVar18 < puVar14) {
        sVar29 = iVar6;
        if (T[PA[*puVar19] + depth + -1] < bVar11) {
          puVar14 = puVar19 + -1;
          puVar8 = (ulong *)last;
          do {
            while ((puVar14 = puVar14 + 1, puVar14 < puVar8 &&
                   (uVar7 = *puVar14, PA[uVar7 + 1] < PA[uVar7] + depth))) {
              *puVar14 = ~uVar7;
            }
            do {
              puVar8 = puVar8 + -1;
              if (puVar8 <= puVar14) {
                if (puVar19 < puVar14) {
                  *puVar19 = ~*puVar19;
                }
                uVar7 = (long)last - (long)puVar14 >> 3;
                puVar19 = puVar14;
                if (((long)last - (long)puVar14 & 0x7f800U) == 0) {
                  sVar29 = lg_table[uVar7 & 0xff];
                }
                else {
                  sVar29 = lg_table[uVar7 >> 8 & 0xff] + 8;
                }
                goto LAB_00103268;
              }
              uVar7 = *puVar8;
            } while (PA[uVar7] + depth <= PA[uVar7 + 1]);
            *puVar8 = *puVar14;
            *puVar14 = ~uVar7;
          } while( true );
        }
LAB_00103268:
        depth = depth + 1;
        first = (saidx64_t *)puVar19;
      }
      else {
        lVar25 = (long)puVar14 - (long)puVar19 >> 3;
        lVar15 = (long)puVar8 - (long)puVar14 >> 3;
        if (lVar15 <= lVar25) {
          lVar25 = lVar15;
        }
        if (0 < lVar25) {
          lVar20 = lVar25 + 1;
          lVar16 = 0;
          do {
            uVar4 = *(undefined8 *)((long)puVar19 + lVar16);
            *(undefined8 *)((long)puVar19 + lVar16) =
                 *(undefined8 *)((long)puVar8 + lVar16 + lVar25 * -8);
            *(undefined8 *)((long)puVar8 + lVar16 + lVar25 * -8) = uVar4;
            lVar20 = lVar20 + -1;
            lVar16 = lVar16 + 8;
          } while (1 < lVar20);
        }
        lVar20 = (long)puVar18 - (long)(puVar8 + -1) >> 3;
        lVar16 = (long)last - (long)puVar18 >> 3;
        lVar25 = lVar16 + -1;
        if (lVar20 < lVar16) {
          lVar25 = lVar20;
        }
        if (0 < lVar25) {
          lVar16 = lVar25 + 1;
          lVar21 = 0;
          do {
            uVar4 = *(undefined8 *)((long)puVar8 + lVar21);
            *(undefined8 *)((long)puVar8 + lVar21) =
                 *(undefined8 *)((long)last + lVar21 + lVar25 * -8);
            *(undefined8 *)((long)last + lVar21 + lVar25 * -8) = uVar4;
            lVar16 = lVar16 + -1;
            lVar21 = lVar21 + 8;
          } while (1 < lVar16);
        }
        puVar14 = puVar19 + lVar15;
        puVar8 = (ulong *)last + -lVar20;
        first = (saidx64_t *)puVar14;
        if (T[PA[*puVar14] + depth + -1] < bVar11) {
          first = (saidx64_t *)(puVar14 + -1);
          puVar18 = puVar8;
          do {
            while ((first = (saidx64_t *)((ulong *)first + 1), first < puVar18 &&
                   (uVar7 = *first, PA[uVar7 + 1] < PA[uVar7] + depth))) {
              *first = ~uVar7;
            }
            do {
              puVar18 = puVar18 + -1;
              if (puVar18 <= first) {
                if (puVar14 < first) {
                  *puVar14 = ~*puVar14;
                }
                goto LAB_00102f69;
              }
              uVar7 = *puVar18;
            } while (PA[uVar7] + depth <= PA[uVar7 + 1]);
            *puVar18 = *first;
            *first = ~uVar7;
          } while( true );
        }
LAB_00102f69:
        uVar32 = (long)puVar8 - (long)first;
        uVar7 = (long)uVar32 >> 3;
        bVar11 = (byte)(uVar7 >> 8);
        if (lVar20 < lVar15) {
          if ((long)uVar7 < lVar15) {
            lVar25 = (long)(int)local_288;
            local_238[lVar25 * 4] = (ulong)puVar19;
            local_238[lVar25 * 4 + 1] = (ulong)puVar14;
            local_238[lVar25 * 4 + 2] = depth;
            *(saint_t *)(local_238 + lVar25 * 4U + 3) = sVar29;
            if ((long)uVar7 < lVar20) {
              local_238[lVar25 * 4 + 4] = (ulong)puVar8;
              local_238[lVar25 * 4 + 5] = (ulong)last;
              alStack_200[lVar25 * 4 + -1] = depth;
              *(saint_t *)(alStack_200 + lVar25 * 4) = sVar29;
LAB_00103034:
              local_288 = (ulong)((int)local_288 + 2);
              depth = depth + 1;
              last = (saidx64_t *)puVar8;
              if ((uVar32 & 0x7f800) == 0) {
                sVar29 = lg_table[uVar7 & 0xff];
              }
              else {
                sVar29 = lg_table[bVar11] + 8;
              }
            }
            else {
              local_238[lVar25 * 4 + 4] = (ulong)first;
              local_238[lVar25 * 4 + 5] = (ulong)puVar8;
              alStack_200[lVar25 * 4 + -1] = depth + 1;
              if ((uVar32 & 0x7f800) == 0) {
                sVar12 = lg_table[uVar7 & 0xff];
              }
              else {
                sVar12 = lg_table[bVar11] + 8;
              }
              local_288 = (ulong)((int)local_288 + 2);
              *(saint_t *)(alStack_200 + lVar25 * 4) = sVar12;
              first = (saidx64_t *)puVar8;
            }
          }
          else {
            lVar25 = (long)(int)local_288;
            local_238[lVar25 * 4] = (ulong)first;
            local_238[lVar25 * 4 + 1] = (ulong)puVar8;
            local_238[lVar25 * 4 + 2] = depth + 1;
            if ((uVar32 & 0x7f800) == 0) {
              sVar12 = lg_table[uVar7 & 0xff];
            }
            else {
              sVar12 = lg_table[bVar11] + 8;
            }
            *(saint_t *)(local_238 + lVar25 * 4U + 3) = sVar12;
            local_238[lVar25 * 4 + 4] = (ulong)puVar19;
            local_238[lVar25 * 4 + 5] = (ulong)puVar14;
            alStack_200[lVar25 * 4 + -1] = depth;
            local_288 = (ulong)((int)local_288 + 2);
            *(saint_t *)(alStack_200 + lVar25 * 4) = sVar29;
            first = (saidx64_t *)puVar8;
          }
        }
        else {
          lVar25 = (long)(int)local_288;
          if ((long)uVar7 < lVar20) {
            local_238[lVar25 * 4] = (ulong)puVar8;
            local_238[lVar25 * 4 + 1] = (ulong)last;
            local_238[lVar25 * 4 + 2] = depth;
            *(saint_t *)(local_238 + lVar25 * 4U + 3) = sVar29;
            if ((long)uVar7 < lVar15) {
              local_238[lVar25 * 4 + 4] = (ulong)puVar19;
              local_238[lVar25 * 4 + 5] = (ulong)puVar14;
              alStack_200[lVar25 * 4 + -1] = depth;
              *(saint_t *)(alStack_200 + lVar25 * 4) = sVar29;
              goto LAB_00103034;
            }
            local_238[lVar25 * 4 + 4] = (ulong)first;
            local_238[lVar25 * 4 + 5] = (ulong)puVar8;
            alStack_200[lVar25 * 4 + -1] = depth + 1;
            if ((uVar32 & 0x7f800) == 0) {
              sVar12 = lg_table[uVar7 & 0xff];
            }
            else {
              sVar12 = lg_table[bVar11] + 8;
            }
            *(saint_t *)(alStack_200 + lVar25 * 4) = sVar12;
          }
          else {
            local_238[lVar25 * 4] = (ulong)first;
            local_238[lVar25 * 4 + 1] = (ulong)puVar8;
            local_238[lVar25 * 4 + 2] = depth + 1;
            if ((uVar32 & 0x7f800) == 0) {
              sVar12 = lg_table[uVar7 & 0xff];
            }
            else {
              sVar12 = lg_table[bVar11] + 8;
            }
            *(saint_t *)(local_238 + lVar25 * 4U + 3) = sVar12;
            local_238[lVar25 * 4 + 4] = (ulong)puVar8;
            local_238[lVar25 * 4 + 5] = (ulong)last;
            alStack_200[lVar25 * 4 + -1] = depth;
            *(saint_t *)(alStack_200 + lVar25 * 4) = sVar29;
          }
          local_288 = (ulong)((int)local_288 + 2);
          last = (saidx64_t *)puVar14;
          first = (saidx64_t *)puVar19;
        }
      }
      goto LAB_001023ef;
    }
    bVar11 = T[PA[*puVar19] + depth];
    puVar14 = puVar19;
    first = (saidx64_t *)puVar19;
    do {
      puVar8 = puVar14;
      bVar1 = bVar11;
      first = (saidx64_t *)((ulong *)first + 1);
      if (last <= first) break;
      puVar19 = puVar19 + 1;
      bVar22 = T[PA[*first] + depth];
      bVar11 = bVar1;
      puVar14 = puVar8;
    } while ((bVar1 == bVar22) ||
            (bVar11 = bVar22, puVar14 = (ulong *)first, (long)puVar19 - (long)puVar8 < 9));
    puVar19 = puVar8;
    if (T[PA[*puVar8] + depth + -1] < bVar1) {
      puVar19 = puVar8 + -1;
      puVar14 = (ulong *)first;
      do {
        while ((puVar19 = puVar19 + 1, puVar19 < puVar14 &&
               (uVar7 = *puVar19, PA[uVar7 + 1] < PA[uVar7] + depth))) {
          *puVar19 = ~uVar7;
        }
        do {
          puVar14 = puVar14 + -1;
          if (puVar14 <= puVar19) {
            if (puVar8 < puVar19) {
              *puVar8 = ~*puVar8;
            }
            goto LAB_0010316d;
          }
          uVar7 = *puVar14;
        } while (PA[uVar7] + depth <= PA[uVar7 + 1]);
        *puVar14 = *puVar19;
        *puVar19 = ~uVar7;
      } while( true );
    }
LAB_0010316d:
    uVar32 = (long)first - (long)puVar19;
    uVar7 = (long)uVar32 >> 3;
    lVar25 = (long)last - (long)first >> 3;
    bVar11 = (byte)(uVar7 >> 8);
    if ((long)uVar7 <= lVar25) goto LAB_001031de;
    if (lVar25 < 2) {
      if ((uVar32 & 0x7f800) == 0) goto LAB_00103313;
      goto LAB_00103246;
    }
    lVar25 = (long)(int)local_288;
    local_238[lVar25 * 4] = (ulong)puVar19;
    local_238[lVar25 * 4 + 1] = (ulong)first;
    local_238[lVar25 * 4 + 2] = depth + 1;
    if ((uVar32 & 0x7f800) == 0) {
      sVar29 = lg_table[uVar7 & 0xff];
    }
    else {
      sVar29 = lg_table[bVar11] + 8;
    }
    local_288 = (ulong)((int)local_288 + 1);
    *(saint_t *)(local_238 + lVar25 * 4U + 3) = sVar29;
    sVar29 = -1;
  } while( true );
LAB_00102530:
  if (iVar6 == 0) {
    *puVar14 = ~*puVar14;
  }
  puVar14[-1] = uVar7;
  puVar19 = puVar19 + -1;
  if (puVar19 < first) goto LAB_0010254d;
  goto LAB_00102438;
LAB_001031de:
  sVar29 = -1;
  if (1 < (long)uVar7) {
    lVar25 = (long)(int)local_288;
    local_238[lVar25 * 4] = (ulong)first;
    local_238[lVar25 * 4 + 1] = (ulong)last;
    local_238[lVar25 * 4 + 2] = depth;
    local_288 = (ulong)((int)local_288 + 1);
    *(undefined4 *)(local_238 + lVar25 * 4U + 3) = 0xffffffff;
    if ((uVar32 & 0x7f800) == 0) {
LAB_00103313:
      sVar29 = lg_table[uVar7 & 0xff];
    }
    else {
LAB_00103246:
      sVar29 = lg_table[bVar11] + 8;
    }
    depth = depth + 1;
    last = first;
    first = (saidx64_t *)puVar19;
  }
  goto LAB_001023ef;
}

Assistant:

static
void
ss_mintrosort(const sauchar_t *T, const saidx_t *PA,
              saidx_t *first, saidx_t *last,
              saidx_t depth) {
#define STACK_SIZE SS_MISORT_STACKSIZE
  struct { saidx_t *a, *b, c; saint_t d; } stack[STACK_SIZE];
  const sauchar_t *Td;
  saidx_t *a, *b, *c, *d, *e, *f;
  saidx_t s, t;
  saint_t ssize;
  saint_t limit;
  saint_t v, x = 0;

  for(ssize = 0, limit = ss_ilg(last - first);;) {

    if((last - first) <= SS_INSERTIONSORT_THRESHOLD) {
#if 1 < SS_INSERTIONSORT_THRESHOLD
      if(1 < (last - first)) { ss_insertionsort(T, PA, first, last, depth); }
#endif
      STACK_POP(first, last, depth, limit);
      continue;
    }

    Td = T + depth;
    if(limit-- == 0) { ss_heapsort(Td, PA, first, last - first); }
    if(limit < 0) {
      for(a = first + 1, v = Td[PA[*first]]; a < last; ++a) {
        if((x = Td[PA[*a]]) != v) {
          if(1 < (a - first)) { break; }
          v = x;
          first = a;
        }
      }
      if(Td[PA[*first] - 1] < v) {
        first = ss_partition(PA, first, a, depth);
      }
      if((a - first) <= (last - a)) {
        if(1 < (a - first)) {
          STACK_PUSH(a, last, depth, -1);
          last = a, depth += 1, limit = ss_ilg(a - first);
        } else {
          first = a, limit = -1;
        }
      } else {
        if(1 < (last - a)) {
          STACK_PUSH(first, a, depth + 1, ss_ilg(a - first));
          first = a, limit = -1;
        } else {
          last = a, depth += 1, limit = ss_ilg(a - first);
        }
      }
      continue;
    }

    /* choose pivot */
    a = ss_pivot(Td, PA, first, last);
    v = Td[PA[*a]];
    SWAP(*first, *a);

    /* partition */
    for(b = first; (++b < last) && ((x = Td[PA[*b]]) == v);) { }
    if(((a = b) < last) && (x < v)) {
      for(; (++b < last) && ((x = Td[PA[*b]]) <= v);) {
        if(x == v) { SWAP(*b, *a); ++a; }
      }
    }
    for(c = last; (b < --c) && ((x = Td[PA[*c]]) == v);) { }
    if((b < (d = c)) && (x > v)) {
      for(; (b < --c) && ((x = Td[PA[*c]]) >= v);) {
        if(x == v) { SWAP(*c, *d); --d; }
      }
    }
    for(; b < c;) {
      SWAP(*b, *c);
      for(; (++b < c) && ((x = Td[PA[*b]]) <= v);) {
        if(x == v) { SWAP(*b, *a); ++a; }
      }
      for(; (b < --c) && ((x = Td[PA[*c]]) >= v);) {
        if(x == v) { SWAP(*c, *d); --d; }
      }
    }

    if(a <= d) {
      c = b - 1;

      if((s = a - first) > (t = b - a)) { s = t; }
      for(e = first, f = b - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
      if((s = d - c) > (t = last - d - 1)) { s = t; }
      for(e = b, f = last - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }

      a = first + (b - a), c = last - (d - c);
      b = (v <= Td[PA[*a] - 1]) ? a : ss_partition(PA, a, c, depth);

      if((a - first) <= (last - c)) {
        if((last - c) <= (c - b)) {
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          STACK_PUSH(c, last, depth, limit);
          last = a;
        } else if((a - first) <= (c - b)) {
          STACK_PUSH(c, last, depth, limit);
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          last = a;
        } else {
          STACK_PUSH(c, last, depth, limit);
          STACK_PUSH(first, a, depth, limit);
          first = b, last = c, depth += 1, limit = ss_ilg(c - b);
        }
      } else {
        if((a - first) <= (c - b)) {
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          STACK_PUSH(first, a, depth, limit);
          first = c;
        } else if((last - c) <= (c - b)) {
          STACK_PUSH(first, a, depth, limit);
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          first = c;
        } else {
          STACK_PUSH(first, a, depth, limit);
          STACK_PUSH(c, last, depth, limit);
          first = b, last = c, depth += 1, limit = ss_ilg(c - b);
        }
      }
    } else {
      limit += 1;
      if(Td[PA[*first] - 1] < v) {
        first = ss_partition(PA, first, last, depth);
        limit = ss_ilg(last - first);
      }
      depth += 1;
    }
  }
#undef STACK_SIZE
}